

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_source_get_length_in_seconds(ma_data_source *pDataSource,float *pLength)

{
  float *in_RSI;
  ma_uint32 *in_RDI;
  ma_format *unaff_retaddr;
  ma_data_source *in_stack_00000008;
  ma_uint32 sampleRate;
  ma_uint64 lengthInPCMFrames;
  ma_result result;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  ma_data_source *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ma_result mVar1;
  
  if (in_RSI == (float *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    *in_RSI = 0.0;
    mVar1 = ma_data_source_get_length_in_pcm_frames
                      (in_stack_ffffffffffffffd8,
                       (ma_uint64 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if ((mVar1 == MA_SUCCESS) &&
       (mVar1 = ma_data_source_get_data_format
                          (in_stack_00000008,unaff_retaddr,
                           (ma_uint32 *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                           (ma_channel *)in_RSI,(ulong)in_stack_ffffffffffffffe0),
       mVar1 == MA_SUCCESS)) {
      *in_RSI = (float)(long)in_stack_ffffffffffffffd8 / (float)in_stack_ffffffffffffffd4;
      mVar1 = MA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_source_get_length_in_seconds(ma_data_source* pDataSource, float* pLength)
{
    ma_result result;
    ma_uint64 lengthInPCMFrames;
    ma_uint32 sampleRate;

    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    result = ma_data_source_get_length_in_pcm_frames(pDataSource, &lengthInPCMFrames);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* VC6 does not support division of unsigned 64-bit integers with floating point numbers. Need to use a signed number. This shouldn't effect anything in practice. */
    *pLength = (ma_int64)lengthInPCMFrames / (float)sampleRate;

    return MA_SUCCESS;
}